

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall
QByteArray::mid(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  QByteArray *pQVar2;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  qsizetype local_28;
  qsizetype local_20;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_28 = len;
  local_20 = pos;
  CVar1 = QtPrivate::QContainerImplHelper::mid((this->d).size,&local_20,&local_28);
  pQVar2 = (QByteArray *)(*(code *)(&DAT_0016edb4 + *(int *)(&DAT_0016edb4 + (ulong)CVar1 * 4)))();
  return pQVar2;
}

Assistant:

QByteArray QByteArray::mid(qsizetype pos, qsizetype len) const &
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QByteArray();
    case QContainerImplHelper::Empty:
    {
        return QByteArray(DataPointer::fromRawData(&_empty, 0));
    }
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        return sliced(p, l);
    }
    Q_UNREACHABLE_RETURN(QByteArray());
}